

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

Am_Type_Support * Am_Find_Support(Am_Value_Type type)

{
  Am_Type_Support *pAVar1;
  Am_Value_Type local_a [4];
  Am_Value_Type type_local;
  
  local_a[0] = type;
  verify_support_table();
  pAVar1 = OpenAmulet::Map<unsigned_short,_Am_Type_Support_*,_std::less<unsigned_short>_>::GetAt
                     (Support_Table,local_a);
  return pAVar1;
}

Assistant:

Am_Type_Support *
Am_Find_Support(Am_Value_Type type)
{
  verify_support_table();
  return Support_Table->GetAt(type);
}